

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

char * __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
          (ShaderImageLoadStoreBase *this,int stage)

{
  int stage_local;
  ShaderImageLoadStoreBase *this_local;
  
  switch(stage) {
  case 0:
    this_local = (ShaderImageLoadStoreBase *)0x2b20119;
    break;
  case 1:
    this_local = (ShaderImageLoadStoreBase *)0x2b20213;
    break;
  case 2:
    this_local = (ShaderImageLoadStoreBase *)0x2b20273;
    break;
  case 3:
    this_local = (ShaderImageLoadStoreBase *)0x2ae8863;
    break;
  case 4:
    this_local = (ShaderImageLoadStoreBase *)0x29deccc;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,599,
                  "const char *gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::StageName(int)"
                 );
  }
  return (char *)this_local;
}

Assistant:

const char* StageName(int stage)
	{
		switch (stage)
		{
		case 0:
			return "Vertex Shader";
		case 1:
			return "Tessellation Control Shader";
		case 2:
			return "Tessellation Evaluation Shader";
		case 3:
			return "Geometry Shader";
		case 4:
			return "Compute Shader";
		}
		assert(0);
		return NULL;
	}